

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O2

void __thiscall
WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
::WorkerQueue(WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
              *this,int numWorkers,
             WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *args,Database<Protein> *args_1,SearchParams<Protein> *args_2)

{
  WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
  *this_00;
  bool bVar1;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_68;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *args_local;
  Database<Protein> *args_local_1;
  type local_50;
  condition_variable *local_48;
  WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
  *local_40;
  WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
  *local_38;
  
  local_68 = args;
  args_local = (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)args_1;
  std::_Deque_base<std::thread,_std::allocator<std::thread>_>::_Deque_base
            ((_Deque_base<std::thread,_std::allocator<std::thread>_> *)this);
  local_48 = (condition_variable *)(this + 0x50);
  std::condition_variable::condition_variable(local_48);
  *(undefined4 *)(this + 0xac) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0x99) = 0;
  *(undefined8 *)(this + 0xa1) = 0;
  std::
  queue<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,std::deque<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,std::allocator<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>>>>
  ::
  queue<std::deque<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,std::allocator<std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>>>,void>
            ((queue<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::allocator<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>_>_>
              *)(this + 0xb0));
  this_00 = this + 0x110;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  local_40 = this + 0xb0;
  std::
  _Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::_Deque_base((_Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                 *)this_00);
  local_38 = this_00;
  if (numWorkers < 1) {
    numWorkers = std::thread::hardware_concurrency();
  }
  while (bVar1 = numWorkers != 0, numWorkers = numWorkers + -1, bVar1) {
    local_50.this =
         (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *)this;
    std::thread::
    thread<WorkerQueue<QueryDatabaseSearcherWorker<Protein>,std::deque<Sequence<Protein>,std::allocator<Sequence<Protein>>>,WorkerQueue<SearchResultsWriterWorker<Protein>,std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::__cxx11::string_const&>*,Database<Protein>const*,SearchParams<Protein>const&>::WorkerQueue(int,WorkerQueue<SearchResultsWriterWorker<Protein>,std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::__cxx11::string_const&>*,Database<Protein>const*,SearchParams<Protein>const&)::_lambda(WorkerQueue<SearchResultsWriterWorker<Protein>,std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::__cxx11::string_const&>*&&,Database<Protein>const*&&,SearchParams<Protein>const&)_1_,WorkerQueue<SearchResultsWriterWorker<Protein>,std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::__cxx11::string_const&>*&,Database<Protein>const*&,SearchParams<Protein>const&,void>
              ((thread *)&args_local_1,&local_50,&local_68,(Database<Protein> **)&args_local,args_2)
    ;
    std::deque<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              ((deque<std::thread,_std::allocator<std::thread>_> *)this,(thread *)&args_local_1);
    std::thread::~thread((thread *)&args_local_1);
  }
  return;
}

Assistant:

WorkerQueue( const int numWorkers = 1, Args... args )
      : mStop( false ), mWorkingCount( 0 ), mTotalEnqueued( 0 ),
        mTotalProcessed( 0 ) {
    auto actualWorkers =
      numWorkers <= 0 ? std::thread::hardware_concurrency() : numWorkers;

    for( int i = 0; i < actualWorkers; i++ ) {
      mWorkers.push_back( std::thread(
        [this]( Args&&... args ) {
          this->WorkerLoop( std::forward< Args >( args )... );
        },
        args... ) );
    }
  }